

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

void dump_monsters(ang_file *fff)

{
  wint_t chr;
  uint8_t attr;
  monster_race *race;
  wchar_t i;
  ang_file *fff_local;
  
  for (race._4_4_ = 0; race._4_4_ < (int)(uint)z_info->r_max; race._4_4_ = race._4_4_ + 1) {
    if (r_info[race._4_4_].name != (char *)0x0) {
      file_putf(fff,"monster:%s:0x%02X:0x%02X\n",r_info[race._4_4_].name,
                (ulong)monster_x_attr[race._4_4_],(ulong)(uint)monster_x_char[race._4_4_]);
    }
  }
  return;
}

Assistant:

void dump_monsters(ang_file *fff)
{
	int i;

	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		uint8_t attr = monster_x_attr[i];
		wint_t chr = monster_x_char[i];

		/* Skip non-entries */
		if (!race->name) continue;

		file_putf(fff, "monster:%s:0x%02X:0x%02X\n", race->name, attr, chr);
	}
}